

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::StatsdPullAtomConfig::operator==
          (StatsdPullAtomConfig *this,StatsdPullAtomConfig *other)

{
  __type_conflict4 _Var1;
  bool bVar2;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  if (_Var1) {
    bVar2 = ::std::operator==(&this->pull_atom_id_,&other->pull_atom_id_);
    if (bVar2) {
      bVar2 = ::std::operator==(&this->raw_pull_atom_id_,&other->raw_pull_atom_id_);
      if ((bVar2) && (this->pull_frequency_ms_ == other->pull_frequency_ms_)) {
        bVar2 = ::std::operator==(&this->packages_,&other->packages_);
        return bVar2;
      }
    }
  }
  return false;
}

Assistant:

bool StatsdPullAtomConfig::operator==(const StatsdPullAtomConfig& other) const {
  return unknown_fields_ == other.unknown_fields_
   && pull_atom_id_ == other.pull_atom_id_
   && raw_pull_atom_id_ == other.raw_pull_atom_id_
   && pull_frequency_ms_ == other.pull_frequency_ms_
   && packages_ == other.packages_;
}